

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void do_cmd_cast(command *cmd)

{
  ushort uVar1;
  _Bool _Var2;
  wchar_t wVar3;
  ulong in_RAX;
  class_spell_conflict *pcVar4;
  wchar_t dir;
  wchar_t spell_index;
  
  _dir = in_RAX & 0xffffffff00000000;
  _Var2 = player_get_resume_normal_shape(player,cmd);
  if (((_Var2) && (_Var2 = player_can_cast(player,true), _Var2)) &&
     (wVar3 = cmd_get_spell((command_conflict *)cmd,"spell",player,&spell_index,"cast",
                            obj_can_cast_from,"There are no spells you can cast.",spell_okay_to_cast
                            ,"That book has no spells that you can cast."), wVar3 == L'\0')) {
    pcVar4 = spell_by_index(player,spell_index);
    if ((int)player->csp < pcVar4->smana) {
      msg("You do not have enough mana to %s this %s.",pcVar4->realm->verb,pcVar4->realm->spell_noun
         );
      event_signal(EVENT_INPUT_FLUSH);
      _Var2 = get_check("Attempt it anyway? ");
      if (!_Var2) {
        return;
      }
    }
    _Var2 = spell_needs_aim(spell_index);
    if (_Var2) {
      wVar3 = cmd_get_target((command_conflict *)cmd,"target",&dir);
      if (wVar3 != L'\0') {
        return;
      }
      player_confuse_dir(player,&dir,false);
    }
    target_fix();
    _Var2 = spell_cast(spell_index,dir,cmd);
    if (_Var2) {
      uVar1 = z_info->move_energy;
      wVar3 = (uint)uVar1 + (uint)uVar1 * 2 >> 2;
      if (player->timed[0x21] == 0) {
        wVar3 = (uint)uVar1;
      }
      player->upkeep->energy_use = wVar3;
    }
    target_release();
  }
  return;
}

Assistant:

void do_cmd_cast(struct command *cmd)
{
	int spell_index, dir = 0;
	const struct class_spell *spell;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Check the player can cast spells at all */
	if (!player_can_cast(player, true))
		return;

	/* Get arguments */
	if (cmd_get_spell(cmd, "spell", player, &spell_index,
			/* Verb */ "cast",
			/* Book */ obj_can_cast_from,
			/* Book error */ "There are no spells you can cast.",
			/* Filter */ spell_okay_to_cast,
			/* Spell error */ "That book has no spells that you can cast.") != CMD_OK) {
		return;
	}

	/* Get the spell */
	spell = spell_by_index(player, spell_index);

	/* Verify "dangerous" spells */
	if (spell->smana > player->csp) {
		const char *verb = spell->realm->verb;
		const char *noun = spell->realm->spell_noun;

		/* Warning */
		msg("You do not have enough mana to %s this %s.", verb, noun);

		/* Flush input */
		event_signal(EVENT_INPUT_FLUSH);

		/* Verify */
		if (!get_check("Attempt it anyway? ")) return;
	}

	if (spell_needs_aim(spell_index)) {
		if (cmd_get_target(cmd, "target", &dir) == CMD_OK)
			player_confuse_dir(player, &dir, false);
		else
			return;
	}

	/* Cast a spell */
	target_fix();
	if (spell_cast(spell_index, dir, cmd)) {
		if (player->timed[TMD_FASTCAST]) {
			player->upkeep->energy_use = (z_info->move_energy * 3) / 4;
		} else {
			player->upkeep->energy_use = z_info->move_energy;
		}
	}
	target_release();
}